

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void __thiscall trieste::logging::Log::end(Log *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Log *this_local;
  
  if (this->print == Active) {
    pbVar1 = detail::
             UnsafeInit<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get(&this->strstream);
    std::ostream::operator<<(&pbVar1->field_0x10,std::endl<char,std::char_traits<char>>);
    pbVar1 = detail::
             UnsafeInit<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get(&this->strstream);
    CLI::std::
    function<void_(std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&dump_callback_abi_cxx11_,pbVar1);
  }
  detail::
  UnsafeInit<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::destruct(&this->strstream);
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void end()
    {
      if (print == Status::Active)
      {
        strstream.get() << std::endl;
        dump_callback(strstream.get());
      }
      strstream.destruct();
    }